

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.hpp
# Opt level: O2

void __thiscall
qclab::qgates::QGate1<std::complex<float>_>::QGate1(QGate1<std::complex<float>_> *this)

{
  (this->super_QObject<std::complex<float>_>)._vptr_QObject = (_func_int **)&PTR_nbQubits_004ca758;
  this->qubit_ = 0;
  return;
}

Assistant:

QGate1( const int qubit )
        : qubit_( qubit )
        {
          assert( qubit >= 0 ) ;
        }